

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noccout.c
# Opt level: O0

Item * vectorize_replacement_item(Item *q)

{
  Item *q1;
  Item *q_local;
  
  if (vectorize_replacements != (List *)0x0) {
    for (q1 = vectorize_replacements->next; q1 != vectorize_replacements; q1 = q1->next) {
      if ((q1->element).itm == q) {
        return q1->next;
      }
    }
  }
  return (Item *)0x0;
}

Assistant:

Item* vectorize_replacement_item(Item* q) {
	Item* q1;
	if (vectorize_replacements) {
		ITERATE(q1, vectorize_replacements) {
			if (ITM(q1) == q) {
				return q1->next;
			}			
		}
	}
	return (Item*)0;
}